

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode urlencode_str(dynbuf *o,char *url,size_t len,_Bool relative,_Bool query)

{
  byte bVar1;
  CURLcode CVar2;
  char *pcVar3;
  byte *pbVar4;
  byte *pbVar5;
  size_t sVar6;
  undefined3 in_register_00000009;
  bool bVar7;
  char *__s;
  bool bVar8;
  
  pbVar4 = (byte *)url;
  if (CONCAT31(in_register_00000009,relative) == 0) {
    pcVar3 = strstr(url,"//");
    __s = pcVar3 + 2;
    if (pcVar3 == (char *)0x0) {
      __s = url;
    }
    pbVar4 = (byte *)strchr(__s,0x3f);
    pbVar5 = (byte *)strchr(__s,0x2f);
    if (pbVar5 == (byte *)0x0) {
      sVar6 = strlen(url);
      pbVar5 = (byte *)(url + sVar6);
    }
    if (pbVar4 == (byte *)0x0) {
      sVar6 = strlen(url);
      pbVar4 = (byte *)(url + sVar6);
    }
    if (pbVar5 < pbVar4) {
      pbVar4 = pbVar5;
    }
  }
  bVar7 = !query;
  do {
    bVar8 = len == 0;
    len = len - 1;
    if (bVar8) {
      return CURLUE_OK;
    }
    if (url < pbVar4) {
LAB_0044e714:
      CVar2 = Curl_dyn_addn(o,url,1);
LAB_0044e71f:
      if (CVar2 != CURLE_OK) {
        return CURLUE_OUT_OF_MEMORY;
      }
    }
    else {
      bVar1 = *url;
      if (bVar1 == 0x3f) {
        bVar7 = false;
LAB_0044e6e4:
        if (0xffffffa1 < bVar1 - 0x7f || (bVar1 < 0x21 || bVar1 == 0x7f)) goto LAB_0044e714;
        CVar2 = Curl_dyn_addf(o,"%%%02x");
        goto LAB_0044e71f;
      }
      if (bVar1 != 0x20) goto LAB_0044e6e4;
      if (bVar7) {
        CVar2 = Curl_dyn_addn(o,"%20",3);
        bVar7 = true;
        goto LAB_0044e71f;
      }
      CVar2 = Curl_dyn_addn(o,"+",1);
      if (CVar2 != CURLE_OK) {
        return CURLUE_OUT_OF_MEMORY;
      }
      bVar7 = false;
    }
    url = (char *)((byte *)url + 1);
  } while( true );
}

Assistant:

static CURLUcode urlencode_str(struct dynbuf *o, const char *url,
                               size_t len, bool relative,
                               bool query)
{
  /* we must add this with whitespace-replacing */
  bool left = !query;
  const unsigned char *iptr;
  const unsigned char *host_sep = (const unsigned char *) url;

  if(!relative)
    host_sep = (const unsigned char *) find_host_sep(url);

  for(iptr = (unsigned char *)url;    /* read from here */
      len; iptr++, len--) {

    if(iptr < host_sep) {
      if(Curl_dyn_addn(o, iptr, 1))
        return CURLUE_OUT_OF_MEMORY;
      continue;
    }

    if(*iptr == ' ') {
      if(left) {
        if(Curl_dyn_addn(o, "%20", 3))
          return CURLUE_OUT_OF_MEMORY;
      }
      else {
        if(Curl_dyn_addn(o, "+", 1))
          return CURLUE_OUT_OF_MEMORY;
      }
      continue;
    }

    if(*iptr == '?')
      left = FALSE;

    if(urlchar_needs_escaping(*iptr)) {
      if(Curl_dyn_addf(o, "%%%02x", *iptr))
        return CURLUE_OUT_OF_MEMORY;
    }
    else {
      if(Curl_dyn_addn(o, iptr, 1))
        return CURLUE_OUT_OF_MEMORY;
    }
  }

  return CURLUE_OK;
}